

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O3

void __thiscall
GraphTestImplicitOutputOnlyOutOfDate::~GraphTestImplicitOutputOnlyOutOfDate
          (GraphTestImplicitOutputOnlyOutOfDate *this)

{
  GraphTest::~GraphTest(&this->super_GraphTest);
  operator_delete(this,0x230);
  return;
}

Assistant:

TEST_F(GraphTest, ImplicitOutputOnlyOutOfDate) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"build | out.imp: cat in\n"));
  fs_.Create("out.imp", "");
  fs_.Tick();
  fs_.Create("in", "");

  string err;
  EXPECT_TRUE(scan_.RecomputeDirty(GetNode("out.imp"), NULL, &err));
  ASSERT_EQ("", err);

  EXPECT_TRUE(GetNode("out.imp")->dirty());
}